

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O0

bool LEARNER::complete_multi_ex(example *ec,multi_ex *ec_seq,vw *all)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  ostream *this;
  example *in_RDX;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  bool is_test_ec;
  undefined7 in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = (**(code **)((in_RDX->super_example_predict).indices._end + 0x370))(in_RDI + 0x457);
  bVar1 = bVar1 & 1;
  bVar2 = example_is_newline_not_header(in_RDX);
  if ((bVar2) && ((bVar1 & 1) != 0)) {
    VW::finish_example((vw *)in_RDX,(example *)CONCAT17(bVar1,in_stack_ffffffffffffffd8));
    sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
    if (sVar3 == 0) {
      this = std::operator<<((ostream *)&std::cout,
                             "Something is wrong---an example with no choice.  Do you have all 0 features? Or multiple empty lines?"
                            );
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    std::vector<example_*,_std::allocator<example_*>_>::push_back(in_RDI,(value_type *)in_RSI);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool complete_multi_ex(example* ec, multi_ex& ec_seq, vw& all)
{
  const bool is_test_ec = all.p->lp.test_label(&ec->l);

  if (example_is_newline_not_header(*ec) && is_test_ec)
  {
    VW::finish_example(all, *ec);
    if (ec_seq.size() == 0)
    {
      cout << "Something is wrong---an example with no choice.  Do you have all 0 features? Or multiple empty lines?"
           << endl;
      return false;
    }
    return true;  // example complete
  }
  ec_seq.push_back(ec);
  return false;
}